

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O1

_Bool design_jewellery(object *obj,wchar_t lev)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  
  potential = lev * 10 + obj->kind->level * 0x28;
  uVar3 = Rand_div(potential / 5);
  iVar1 = (int)((ulong)((long)potential * -0x66666667) >> 0x20);
  potential = ((iVar1 >> 2) - (iVar1 >> 0x1f)) + potential + uVar3;
  initial_potential = potential;
  _Var2 = choose_type(obj);
  if (_Var2) {
    haggle_till_done((artifact *)0x0,obj);
    uVar3 = Rand_div(100);
    if ((int)uVar3 < 5) {
      make_terrible((artifact *)0x0,obj);
    }
    final_check((artifact *)0x0,obj);
  }
  return _Var2;
}

Assistant:

bool design_jewellery(struct object *obj, int lev)
{

	/* Assign it a potential. */
	allocate_potential(obj, lev);

	/* Assign a type. */
	if (!choose_type(obj))
		return false;

	/* Add extra qualities until done. */
	haggle_till_done(NULL, obj);

	/* Decide if the object is to be terrible. */
	if (TERRIBLE_CHANCE > randint0(100)) {

		/* If it is, add a few benefits and more drawbacks. */
		make_terrible(NULL, obj);
	}

	/* Remove contradictory powers. */
	final_check(NULL, obj);

	return true;
}